

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_arithmetic(void)

{
  unique_ptr<Calc,_std::default_delete<Calc>_> this;
  double dVar1;
  allocator<char> local_31;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  string local_28;
  
  DefaultCalc();
  this = calc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"5 1 2 + 4 * + 3 -",&local_31);
  dVar1 = Calc::eval((Calc *)this._M_t.super___uniq_ptr_impl<Calc,_std::default_delete<Calc>_>._M_t.
                             super__Tuple_impl<0UL,_Calc_*,_std::default_delete<Calc>_>.
                             super__Head_base<0UL,_Calc_*,_false>._M_head_impl,&local_28);
  AssertEqD(dVar1,14.0,0x3a);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"15 7 1 1 + - / 3 * 2 1 1 + + -",&local_31);
  dVar1 = Calc::eval((Calc *)calc._M_t.super___uniq_ptr_impl<Calc,_std::default_delete<Calc>_>._M_t.
                             super__Tuple_impl<0UL,_Calc_*,_std::default_delete<Calc>_>.
                             super__Head_base<0UL,_Calc_*,_false>._M_head_impl,&local_28);
  AssertEqD(dVar1,5.0,0x3c);
  std::__cxx11::string::~string((string *)&local_28);
  std::unique_ptr<Calc,_std::default_delete<Calc>_>::~unique_ptr(&calc);
  return;
}

Assistant:

void test_arithmetic() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("5 1 2 + 4 * + 3 -"), 14.0, __LINE__);
  // 15 7 1 1 + - / 3 * 2 1 1 + + 1
  AssertEqD(calc->eval("15 7 1 1 + - / 3 * 2 1 1 + + -"), 5.0, __LINE__);
}